

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void av1_loop_restoration_filter_frame_init
               (AV1LrStruct *lr_ctxt,YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,int optimized_lr,
               int num_planes)

{
  int iVar1;
  int in_ECX;
  long lVar2;
  long lVar3;
  AV1_COMMON *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  FilterFrameCtxt *lr_plane_ctxt;
  int plane_h;
  int plane_w;
  int is_uv;
  RestorationType rtype;
  RestorationInfo *rsi;
  YV12_BUFFER_CONFIG *in_stack_00000068;
  int plane;
  int frame_height;
  int frame_width;
  int highbd;
  int bit_depth;
  SequenceHeader *seq_params;
  int in_stack_000000b0;
  int in_stack_000000b8;
  aom_codec_frame_buffer_t *in_stack_000000c0;
  aom_get_frame_buffer_cb_fn_t in_stack_000000c8;
  void *in_stack_000000d0;
  int in_stack_000000e0;
  int in_stack_ffffffffffffff5c;
  int border_horz;
  int in_stack_ffffffffffffff64;
  undefined8 uVar4;
  uint8_t *data;
  int highbd_00;
  bool local_62;
  bool local_61;
  int local_58;
  int local_54;
  uint local_50;
  RestorationType local_4c;
  RestorationInfo *local_48;
  int local_3c;
  undefined4 local_38;
  undefined4 local_34;
  uint local_30;
  aom_bit_depth_t local_2c;
  SequenceHeader *local_28;
  int local_20;
  int local_1c;
  AV1_COMMON *local_18;
  long local_10;
  undefined8 *local_8;
  
  local_28 = in_RDX->seq_params;
  local_2c = local_28->bit_depth;
  local_30 = (uint)local_28->use_highbitdepth;
  in_RDI[0x17] = &in_RDX->rst_frame;
  local_34 = *(undefined4 *)(in_RSI + 0x10);
  local_38 = *(undefined4 *)(in_RSI + 0x18);
  border_horz = (in_RDX->features).byte_alignment;
  uVar4 = 0;
  data = (uint8_t *)0x0;
  highbd_00 = 0;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar1 = aom_realloc_frame_buffer
                    (in_stack_00000068,rsi._4_4_,(int)rsi,rtype,is_uv,plane_w,in_stack_000000b0,
                     in_stack_000000b8,in_stack_000000c0,in_stack_000000c8,in_stack_000000d0,
                     plane_h._3_1_,in_stack_000000e0);
  if (iVar1 != 0) {
    aom_internal_error(local_18->error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate restoration dst buffer");
  }
  *local_8 = filter_frame_on_unit;
  local_8[0x16] = local_10;
  for (local_3c = 0; local_3c < local_20; local_3c = local_3c + 1) {
    local_48 = local_18->rst_info + local_3c;
    local_4c = local_48->frame_restoration_type;
    local_48->optimized_lr = local_1c;
    local_8[(long)local_3c * 7 + 1] = local_48;
    if (local_4c != RESTORE_NONE) {
      local_50 = (uint)(0 < local_3c);
      av1_get_upsampled_plane_size(local_18,local_50,&local_54,&local_58);
      av1_extend_frame(data,(int)((ulong)uVar4 >> 0x20),(int)uVar4,in_stack_ffffffffffffff64,
                       border_horz,in_stack_ffffffffffffff5c,highbd_00);
      lVar2 = (long)local_3c;
      lVar3 = lVar2 * 0x38;
      local_61 = false;
      if (local_50 != 0) {
        local_61 = local_28->subsampling_x != 0;
      }
      *(uint *)(local_8 + lVar2 * 7 + 2) = (uint)local_61;
      local_62 = false;
      if (local_50 != 0) {
        local_62 = local_28->subsampling_y != 0;
      }
      *(uint *)((long)local_8 + lVar3 + 0x14) = (uint)local_62;
      *(int *)(local_8 + lVar2 * 7 + 3) = local_54;
      *(int *)((long)local_8 + lVar3 + 0x1c) = local_58;
      *(uint *)(local_8 + lVar2 * 7 + 4) = local_30;
      *(aom_bit_depth_t *)((long)local_8 + lVar3 + 0x24) = local_2c;
      local_8[lVar2 * 7 + 5] = *(undefined8 *)(local_10 + 0x28 + (long)local_3c * 8);
      local_8[lVar2 * 7 + 6] = *(undefined8 *)(local_8[0x17] + 0x28 + (long)local_3c * 8);
      *(undefined4 *)(local_8 + lVar2 * 7 + 7) =
           *(undefined4 *)(local_10 + 0x20 + (long)(int)local_50 * 4);
      *(undefined4 *)((long)local_8 + lVar3 + 0x3c) =
           *(undefined4 *)(local_8[0x17] + 0x20 + (long)(int)local_50 * 4);
    }
  }
  return;
}

Assistant:

void av1_loop_restoration_filter_frame_init(AV1LrStruct *lr_ctxt,
                                            YV12_BUFFER_CONFIG *frame,
                                            AV1_COMMON *cm, int optimized_lr,
                                            int num_planes) {
  const SequenceHeader *const seq_params = cm->seq_params;
  const int bit_depth = seq_params->bit_depth;
  const int highbd = seq_params->use_highbitdepth;
  lr_ctxt->dst = &cm->rst_frame;

  const int frame_width = frame->crop_widths[0];
  const int frame_height = frame->crop_heights[0];
  if (aom_realloc_frame_buffer(
          lr_ctxt->dst, frame_width, frame_height, seq_params->subsampling_x,
          seq_params->subsampling_y, highbd, AOM_RESTORATION_FRAME_BORDER,
          cm->features.byte_alignment, NULL, NULL, NULL, false,
          0) != AOM_CODEC_OK)
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate restoration dst buffer");

  lr_ctxt->on_rest_unit = filter_frame_on_unit;
  lr_ctxt->frame = frame;
  for (int plane = 0; plane < num_planes; ++plane) {
    RestorationInfo *rsi = &cm->rst_info[plane];
    RestorationType rtype = rsi->frame_restoration_type;
    rsi->optimized_lr = optimized_lr;
    lr_ctxt->ctxt[plane].rsi = rsi;

    if (rtype == RESTORE_NONE) {
      continue;
    }

    const int is_uv = plane > 0;
    int plane_w, plane_h;
    av1_get_upsampled_plane_size(cm, is_uv, &plane_w, &plane_h);
    assert(plane_w == frame->crop_widths[is_uv]);
    assert(plane_h == frame->crop_heights[is_uv]);

    av1_extend_frame(frame->buffers[plane], plane_w, plane_h,
                     frame->strides[is_uv], RESTORATION_BORDER,
                     RESTORATION_BORDER, highbd);

    FilterFrameCtxt *lr_plane_ctxt = &lr_ctxt->ctxt[plane];
    lr_plane_ctxt->ss_x = is_uv && seq_params->subsampling_x;
    lr_plane_ctxt->ss_y = is_uv && seq_params->subsampling_y;
    lr_plane_ctxt->plane_w = plane_w;
    lr_plane_ctxt->plane_h = plane_h;
    lr_plane_ctxt->highbd = highbd;
    lr_plane_ctxt->bit_depth = bit_depth;
    lr_plane_ctxt->data8 = frame->buffers[plane];
    lr_plane_ctxt->dst8 = lr_ctxt->dst->buffers[plane];
    lr_plane_ctxt->data_stride = frame->strides[is_uv];
    lr_plane_ctxt->dst_stride = lr_ctxt->dst->strides[is_uv];
  }
}